

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_space_time_stack.cpp
# Opt level: O2

void __thiscall
KokkosTools::SpaceTimeStack::StackNode::print_recursive_json
          (StackNode *this,ostream *os,StackNode *parent,double tree_time)

{
  _Rb_tree_header *p_Var1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ostream *poVar9;
  _Rb_tree_node_base *p_Var10;
  _Base_ptr p_Var11;
  char *pcVar12;
  double dVar13;
  double local_a8;
  set<const_KokkosTools::SpaceTimeStack::StackNode_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_kokkos[P]kokkos_tools_profiling_space_time_stack_kp_space_time_stack_cpp:308:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
  children_by_time;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  dVar13 = (this->total_runtime / tree_time) * 100.0;
  if (output_threshold <= dVar13) {
    if ((this->name)._M_string_length != 0) {
      if (print_recursive_json::add_comma) {
        std::operator<<(os,",\n");
      }
      print_recursive_json::add_comma = true;
      std::operator<<(os,"{\n");
      dVar2 = this->max_runtime;
      dVar3 = this->avg_runtime;
      std::operator<<(os,"\"average-time\" : ");
      lVar6 = *(long *)os;
      lVar7 = *(long *)(lVar6 + -0x18);
      *(uint *)(os + lVar7 + 0x18) = *(uint *)(os + lVar7 + 0x18) & 0xfffffefb | 0x100;
      *(undefined8 *)(os + *(long *)(lVar6 + -0x18) + 8) = 2;
      poVar9 = std::ostream::_M_insert<double>(this->avg_runtime);
      std::operator<<(poVar9,",\n");
      lVar6 = *(long *)os;
      lVar7 = *(long *)(lVar6 + -0x18);
      *(uint *)(os + lVar7 + 0x18) = *(uint *)(os + lVar7 + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(os + *(long *)(lVar6 + -0x18) + 8) = 1;
      dVar4 = this->total_kokkos_runtime;
      dVar5 = this->total_runtime;
      std::operator<<(os,"\"percent\" : ");
      poVar9 = std::ostream::_M_insert<double>(dVar13);
      std::operator<<(poVar9,",\n");
      std::operator<<(os,"\"percent-kokkos\" : ");
      poVar9 = std::ostream::_M_insert<double>((dVar4 / dVar5) * 100.0);
      std::operator<<(poVar9,",\n");
      std::operator<<(os,"\"imbalance\" : ");
      poVar9 = std::ostream::_M_insert<double>((dVar2 / dVar3 + -1.0) * 100.0);
      std::operator<<(poVar9,",\n");
      if (this->kind == STACK_REGION) {
        p_Var10 = (this->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        local_a8 = 0.0;
        for (; (_Rb_tree_header *)p_Var10 != &(this->children)._M_t._M_impl.super__Rb_tree_header;
            p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
          local_a8 = local_a8 + *(double *)(p_Var10 + 4);
        }
        dVar13 = this->total_runtime;
        lVar6 = this->total_number_of_kernel_calls;
        dVar2 = this->avg_runtime;
        std::operator<<(os,"\"remainder\" : ");
        poVar9 = std::ostream::_M_insert<double>((1.0 - local_a8 / dVar13) * 100.0);
        std::operator<<(poVar9,",\n");
        lVar7 = *(long *)os;
        lVar8 = *(long *)(lVar7 + -0x18);
        *(uint *)(os + lVar8 + 0x18) = *(uint *)(os + lVar8 + 0x18) & 0xfffffefb | 0x100;
        *(undefined8 *)(os + *(long *)(lVar7 + -0x18) + 8) = 2;
        std::operator<<(os,"\"kernels-per-second\" : ");
        poVar9 = std::ostream::_M_insert<double>((double)lVar6 / dVar2);
        pcVar12 = ",\n";
      }
      else {
        std::operator<<(os,"\"remainder\" : \"N/A\",\n");
        pcVar12 = "\"kernels-per-second\" : \"N/A\",\n";
        poVar9 = os;
      }
      std::operator<<(poVar9,pcVar12);
      poVar9 = std::operator<<(os,"\"number-of-calls\" : ");
      poVar9 = std::ostream::_M_insert<long>((long)poVar9);
      std::operator<<(poVar9,",\n");
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
                (&local_50,"\"",0x10);
      std::
      regex_replace<std::__cxx11::regex_traits<char>,char,std::char_traits<char>,std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &children_by_time,&this->name,&local_50,"\\\"",0);
      std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&local_50);
      poVar9 = std::operator<<(os,"\"name\" : \"");
      poVar9 = std::operator<<(poVar9,(string *)&children_by_time);
      std::operator<<(poVar9,"\",\n");
      poVar9 = std::operator<<(os,"\"parent-id\" : \"");
      poVar9 = std::ostream::_M_insert<void_const*>(poVar9);
      std::operator<<(poVar9,"\",\n");
      poVar9 = std::operator<<(os,"\"id\" : \"");
      poVar9 = std::ostream::_M_insert<void_const*>(poVar9);
      std::operator<<(poVar9,"\",\n");
      std::operator<<(os,"\"kernel-type\" : ");
      if ((ulong)this->kind < 5) {
        std::operator<<(os,&DAT_0013a80c + *(int *)(&DAT_0013a80c + (ulong)this->kind * 4));
      }
      std::operator<<(os,"\n}");
      std::__cxx11::string::~string((string *)&children_by_time);
    }
    if ((this->children)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      p_Var1 = &children_by_time._M_t._M_impl.super__Rb_tree_header;
      children_by_time._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      children_by_time._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      children_by_time._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      p_Var11 = (this->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      children_by_time._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
      children_by_time._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
      for (; p_Var10 = children_by_time._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
          (_Rb_tree_header *)p_Var11 != &(this->children)._M_t._M_impl.super__Rb_tree_header;
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11)) {
        local_50._0_8_ = p_Var11 + 1;
        std::
        _Rb_tree<KokkosTools::SpaceTimeStack::StackNode_const*,KokkosTools::SpaceTimeStack::StackNode_const*,std::_Identity<KokkosTools::SpaceTimeStack::StackNode_const*>,KokkosTools::SpaceTimeStack::StackNode::print_recursive_json(std::ostream&,KokkosTools::SpaceTimeStack::StackNode_const*,double)const::{lambda(KokkosTools::SpaceTimeStack::StackNode_const*,KokkosTools::SpaceTimeStack::StackNode_const*)#1},std::allocator<KokkosTools::SpaceTimeStack::StackNode_const*>>
        ::_M_insert_unique<KokkosTools::SpaceTimeStack::StackNode_const*>
                  ((_Rb_tree<KokkosTools::SpaceTimeStack::StackNode_const*,KokkosTools::SpaceTimeStack::StackNode_const*,std::_Identity<KokkosTools::SpaceTimeStack::StackNode_const*>,KokkosTools::SpaceTimeStack::StackNode::print_recursive_json(std::ostream&,KokkosTools::SpaceTimeStack::StackNode_const*,double)const::_lambda(KokkosTools::SpaceTimeStack::StackNode_const*,KokkosTools::SpaceTimeStack::StackNode_const*)_1_,std::allocator<KokkosTools::SpaceTimeStack::StackNode_const*>>
                    *)&children_by_time,(StackNode **)&local_50);
      }
      for (; (_Rb_tree_header *)p_Var10 != p_Var1;
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
        print_recursive_json(*(StackNode **)(p_Var10 + 1),os,this,tree_time);
      }
      std::
      _Rb_tree<const_KokkosTools::SpaceTimeStack::StackNode_*,_const_KokkosTools::SpaceTimeStack::StackNode_*,_std::_Identity<const_KokkosTools::SpaceTimeStack::StackNode_*>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/space-time-stack/kp_space_time_stack.cpp:308:20),_std::allocator<const_KokkosTools::SpaceTimeStack::StackNode_*>_>
      ::~_Rb_tree(&children_by_time._M_t);
    }
  }
  return;
}

Assistant:

void print_recursive_json(std::ostream& os, StackNode const* parent,
                            double tree_time) const {
    static bool add_comma = false;
    auto percent          = (total_runtime / tree_time) * 100.0;

    if (percent < output_threshold) return;
    if (!name.empty()) {
      if (add_comma) os << ",\n";
      add_comma = true;
      os << "{\n";
      auto imbalance = (max_runtime / avg_runtime - 1.0) * 100.0;
      os << "\"average-time\" : ";
      os << std::scientific << std::setprecision(2);
      os << avg_runtime << ",\n";
      os << std::fixed << std::setprecision(1);
      auto percent_kokkos = (total_kokkos_runtime / total_runtime) * 100.0;

      os << "\"percent\" : " << percent << ",\n";
      os << "\"percent-kokkos\" : " << percent_kokkos << ",\n";
      os << "\"imbalance\" : " << imbalance << ",\n";

      // Sum over kids if we're a region
      if (kind == STACK_REGION) {
        double child_runtime = 0.0;
        for (auto& child : children) {
          child_runtime += child.total_runtime;
        }
        auto remainder = (1.0 - child_runtime / total_runtime) * 100.0;
        double kps     = total_number_of_kernel_calls / avg_runtime;
        os << "\"remainder\" : " << remainder << ",\n";
        os << std::scientific << std::setprecision(2);
        os << "\"kernels-per-second\" : " << kps << ",\n";
      } else {
        os << "\"remainder\" : \"N/A\",\n";
        os << "\"kernels-per-second\" : \"N/A\",\n";
      }
      os << "\"number-of-calls\" : " << number_of_calls << ",\n";
      auto name_escape_double_quote_twices =
          std::regex_replace(name, std::regex("\""), "\\\"");
      os << "\"name\" : \"" << name_escape_double_quote_twices << "\",\n";
      os << "\"parent-id\" : \"" << parent << "\",\n";
      os << "\"id\" : \"" << this << "\",\n";

      os << "\"kernel-type\" : ";
      switch (kind) {
        case STACK_FOR: os << "\"for\""; break;
        case STACK_REDUCE: os << "\"reduce\""; break;
        case STACK_SCAN: os << "\"scan\""; break;
        case STACK_REGION: os << "\"region\""; break;
        case STACK_COPY: os << "\"copy\""; break;
      };

      os << "\n}";
    }
    if (children.empty()) return;
    auto by_time = [](StackNode const* a, StackNode const* b) {
      if (a->total_runtime != b->total_runtime) {
        return a->total_runtime > b->total_runtime;
      }
      return a->name < b->name;
    };
    std::set<StackNode const*, decltype(by_time)> children_by_time(by_time);
    for (auto& child : children) {
      children_by_time.insert(&child);
    }
    auto last = children_by_time.end();
    --last;
    for (auto it = children_by_time.begin(); it != children_by_time.end();
         ++it) {
      auto child = *it;
      child->print_recursive_json(os, this, tree_time);
    }
  }